

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.hxx
# Opt level: O2

void __thiscall
stateObservation::
IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
::readVectorsFromFile
          (IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           *this,char *filename,bool withTimeStamp)

{
  Scalar SVar1;
  uint uVar2;
  uint uVar3;
  char cVar4;
  Scalar *pSVar5;
  undefined7 in_register_00000011;
  Index i;
  long index;
  int k;
  undefined4 local_42c;
  vector<double,_std::allocator<double>_> doublecontainer;
  Vector v;
  string s;
  double component;
  ifstream f;
  uint auStack_3a0 [122];
  stringstream ss;
  uint auStack_198 [90];
  
  local_42c = (undefined4)CONCAT71(in_register_00000011,withTimeStamp);
  reset(this);
  std::ifstream::ifstream(&f);
  std::ifstream::open((char *)&f,(_Ios_Openmode)filename);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 != '\0') {
    s._M_dataplus._M_p = (pointer)&s.field_2;
    s._M_string_length = 0;
    s.field_2._M_local_buf[0] = '\0';
    k = 0;
    v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    do {
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&f,(string *)&s);
      std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)&s,_S_out|_S_in);
      if ((char)local_42c != '\0') {
        std::istream::operator>>((istream *)&ss,&k);
      }
      uVar2 = *(uint *)((long)auStack_3a0 + *(long *)(_f + -0x18));
      if ((uVar2 & 5) != 0) {
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        break;
      }
      doublecontainer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      doublecontainer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      doublecontainer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      do {
        std::istream::_M_extract<double>((double *)&ss);
        uVar3 = *(uint *)((long)auStack_198 + *(long *)(_ss + -0x18));
        if ((uVar3 & 5) != 0) break;
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)
                   &doublecontainer.super__Vector_base<double,_std::allocator<double>_>,&component);
      } while ((uVar3 & 5) == 0);
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&v,
                 (long)doublecontainer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)doublecontainer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3);
      for (index = 0;
          index < (long)doublecontainer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)doublecontainer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3; index = index + 1) {
        SVar1 = doublecontainer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[index];
        pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&v,index);
        *pSVar5 = SVar1;
      }
      setValue(this,(Matrix<double,__1,_1,_0,__1,_1> *)&v,(long)k);
      k = k + 1;
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&doublecontainer.super__Vector_base<double,_std::allocator<double>_>);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    } while ((uVar2 & 5) == 0);
    free(v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    std::__cxx11::string::~string((string *)&s);
  }
  std::ifstream::~ifstream(&f);
  return;
}

Assistant:

void IndexedMatrixArrayT<MatrixType, Allocator>::readVectorsFromFile(const char * filename, bool withTimeStamp )
{
  reset();

  std::ifstream f;

  f.open(filename);

  if (f.is_open())
  {
    std::string s;
    Vector v;
    int k=0;

    bool continuation=true;

    while (continuation)
    {
      std::getline(f,s);

      std::stringstream ss(s);

      if (withTimeStamp)
      {
        ss >> k;
      }



      if (f.fail())
        continuation=false;
      else
      {
        std::vector<double> doublecontainer;
        double component;
        bool readingVector = true;
        while (readingVector)
        {
          ss>> component;

          if (ss.fail())
          {
            readingVector=false;
          }
          else
          {
            doublecontainer.push_back(component);
          }
        }
        v.resize(Index(doublecontainer.size()));
        for (Index i=0 ; i<Index(doublecontainer.size()) ; ++i)
        {
          v(i)=doublecontainer[size_t(i)];
        }
        setValue(v,k);
        ++k;

      }
    }
  }
}